

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O3

int adiak_launchdate(void)

{
  int iVar1;
  int iVar2;
  timeval stime;
  timeval local_18;
  
  iVar1 = adksys_starttime(&local_18);
  iVar2 = -1;
  if ((iVar1 != -1) && (local_18.tv_usec != 0 || local_18.tv_sec != 0)) {
    iVar2 = 0;
    adiak_namevalue("launchdate",2,"runinfo","%D");
  }
  return iVar2;
}

Assistant:

int adiak_launchdate()
{
   int result;
   struct timeval stime;
   result = adksys_starttime(&stime);
   if (result == -1)
      return -1;
   if (stime.tv_sec == 0 && stime.tv_usec == 0)
      return -1;
   adiak_namevalue("launchdate", adiak_general, "runinfo", "%D", stime.tv_sec);
   return 0;
}